

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> *
pred_intersection(vector<int,_std::allocator<int>_> *__return_storage_ptr__,
                 map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                 *nodes,int n,
                 map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                 *dom)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  iterator iVar3;
  iterator iVar4;
  ulong uVar5;
  int n_local;
  vector<int,_std::allocator<int>_> v2;
  vector<int,_std::allocator<int>_> v1;
  _Vector_base<int,_std::allocator<int>_> local_d8;
  _Vector_base<int,_std::allocator<int>_> local_c0;
  _Vector_base<int,_std::allocator<int>_> local_a8;
  _Vector_base<int,_std::allocator<int>_> local_90;
  _Vector_base<int,_std::allocator<int>_> local_78;
  _Vector_base<int,_std::allocator<int>_> local_60;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  n_local = n;
  iVar3 = std::
          _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
          ::find(&nodes->_M_t,&n_local);
  if ((_Rb_tree_header *)iVar3._M_node == &(nodes->_M_t)._M_impl.super__Rb_tree_header) {
LAB_0017531a:
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    p_Var1 = iVar3._M_node[1]._M_parent;
    iVar4 = std::
            _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
            ::find(&dom->_M_t,&n_local);
    std::vector<int,_std::allocator<int>_>::vector
              (&v1,(vector<int,_std::allocator<int>_> *)&iVar4._M_node[1]._M_parent);
    p_Var2 = p_Var1[1]._M_right;
    if (*(long *)(p_Var1 + 2) - (long)p_Var2 == 8) {
      iVar4 = std::
              _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::find(&dom->_M_t,*(key_type **)p_Var2);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_90,&v1);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_a8,
                 (vector<int,_std::allocator<int>_> *)&iVar4._M_node[1]._M_parent);
      vectors_set_union(&v2,(vector<int,_std::allocator<int>_> *)&local_90,
                        (vector<int,_std::allocator<int>_> *)&local_a8);
      std::vector<int,_std::allocator<int>_>::_M_move_assign
                (&v1,&v2.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&v2.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_a8);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_90);
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_start =
           v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      ;
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_finish =
           v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
      v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)0x0;
      v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
    }
    else {
      if ((ulong)(*(long *)(p_Var1 + 2) - (long)p_Var2) < 9) {
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&v1.super__Vector_base<int,_std::allocator<int>_>);
        goto LAB_0017531a;
      }
      iVar4 = std::
              _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::find(&dom->_M_t,*(key_type **)p_Var2);
      std::vector<int,_std::allocator<int>_>::vector
                (&v2,(vector<int,_std::allocator<int>_> *)&iVar4._M_node[1]._M_parent);
      for (uVar5 = 1; uVar5 < (ulong)(*(long *)(p_Var1 + 2) - (long)p_Var1[1]._M_right >> 3);
          uVar5 = uVar5 + 1) {
        iVar4 = std::
                _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::find(&dom->_M_t,*(key_type **)(&(p_Var1[1]._M_right)->_M_color + uVar5 * 2));
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&local_60,&v2);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&local_78,
                   (vector<int,_std::allocator<int>_> *)&iVar4._M_node[1]._M_parent);
        vectors_intersection
                  ((vector<int,_std::allocator<int>_> *)&local_48,
                   (vector<int,_std::allocator<int>_> *)&local_60,
                   (vector<int,_std::allocator<int>_> *)&local_78);
        std::vector<int,_std::allocator<int>_>::_M_move_assign(&v2,&local_48);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_78);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_60);
      }
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_c0,&v1);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_d8,&v2);
      vectors_set_union(__return_storage_ptr__,(vector<int,_std::allocator<int>_> *)&local_c0,
                        (vector<int,_std::allocator<int>_> *)&local_d8);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_d8);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_c0);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&v2.super__Vector_base<int,_std::allocator<int>_>);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&v1.super__Vector_base<int,_std::allocator<int>_>);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int> pred_intersection(map<int, BasicBlock*> nodes, int n,
                              map<int, vector<int>> dom) {
  // intersect dom of all direct precursor nodes of n and merged with dom of n
  map<int, BasicBlock*>::iterator it = nodes.find(n);
  // cout << "$$" << n << endl;
  if (it != nodes.end()) {
    BasicBlock* b = it->second;
    map<int, vector<int>>::iterator iter = dom.find(n);
    vector<int> v1 = iter->second;
    // cout << "$$" << b->preBlock.size() << endl;
    if (b->preBlock.size() == 1) {
      iter = dom.find(b->preBlock[0]->id);
      v1 = vectors_set_union(v1, iter->second);
      // cout << b->id << "**" << v1[0] << endl;
      return v1;
    } else if (b->preBlock.size() >= 2) {
      iter = dom.find(b->preBlock[0]->id);
      vector<int> v2 = iter->second;
      for (int i = 1; i < b->preBlock.size(); i++) {
        iter = dom.find(b->preBlock[i]->id);
        v2 = vectors_intersection(v2, iter->second);
      }
      return vectors_set_union(v1, v2);
    } else {
      // error
    }
  }
  vector<int> v;
  return v;
}